

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

int lj_cparse(CPState *cp)

{
  CTypeID CVar1;
  uint32_t uVar2;
  CTState *pCVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 local_1dc [196];
  undefined1 local_118 [256];
  
  CVar1 = cp->cts->top;
  memcpy(local_1dc,&cp->cts->sizetab,0x1c4);
  iVar4 = lj_vm_cpcall(cp->L,0,cp,cpcparser);
  if (iVar4 != 0) {
    pCVar3 = cp->cts;
    pCVar3->top = CVar1;
    memcpy(pCVar3->hash,local_118,0x100);
  }
  uVar5 = (ulong)(cp->L->glref).ptr32;
  uVar2 = (cp->sb).b.ptr32;
  uVar6 = (cp->sb).e.ptr32 - uVar2;
  *(int *)(uVar5 + 0x50) = *(int *)(uVar5 + 0x50) - uVar6;
  *(long *)(uVar5 + 0x90) = *(long *)(uVar5 + 0x90) + (ulong)uVar6;
  (**(code **)(uVar5 + 0x40))(*(undefined8 *)(uVar5 + 0x48),uVar2,(ulong)uVar6,0);
  return iVar4;
}

Assistant:

int lj_cparse(CPState *cp)
{
  LJ_CTYPE_SAVE(cp->cts);
  int errcode = lj_vm_cpcall(cp->L, NULL, cp, cpcparser);
  if (errcode)
    LJ_CTYPE_RESTORE(cp->cts);
  cp_cleanup(cp);
  return errcode;
}